

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spng.c
# Opt level: O0

int spng_set_ihdr(spng_ctx *ctx,spng_ihdr *ihdr)

{
  uint32_t uVar1;
  uint8_t uVar2;
  uint8_t uVar3;
  uint8_t uVar4;
  uint8_t uVar5;
  undefined3 uVar6;
  int ret;
  spng_ihdr *ihdr_local;
  spng_ctx *ctx_local;
  
  if ((ctx == (spng_ctx *)0x0) || (ihdr == (spng_ihdr *)0x0)) {
    ctx_local._4_4_ = 1;
  }
  else if ((ctx->data == (uchar *)0x0) && ((*(ushort *)&ctx->field_0xcc >> 4 & 1) == 0)) {
    ctx_local._4_4_ = 0x52;
  }
  else {
    ctx_local._4_4_ = read_chunks(ctx,0);
    if (ctx_local._4_4_ == 0) {
      if (((uint)ctx->stored & 1) == 0) {
        ctx_local._4_4_ = check_ihdr(ihdr,ctx->max_width,ctx->max_height);
        if (ctx_local._4_4_ == 0) {
          uVar1 = ihdr->height;
          (ctx->ihdr).width = ihdr->width;
          (ctx->ihdr).height = uVar1;
          uVar2 = ihdr->color_type;
          uVar3 = ihdr->compression_method;
          uVar4 = ihdr->filter_method;
          uVar5 = ihdr->interlace_method;
          uVar6 = *(undefined3 *)&ihdr->field_0xd;
          (ctx->ihdr).bit_depth = ihdr->bit_depth;
          (ctx->ihdr).color_type = uVar2;
          (ctx->ihdr).compression_method = uVar3;
          (ctx->ihdr).filter_method = uVar4;
          (ctx->ihdr).interlace_method = uVar5;
          *(undefined3 *)&(ctx->ihdr).field_0xd = uVar6;
          ctx->stored = (spng_chunk_bitfield)((uint)ctx->stored & 0xfffffffe | 1);
          ctx->user = (spng_chunk_bitfield)((uint)ctx->user & 0xfffffffe | 1);
          ctx_local._4_4_ = 0;
        }
      }
      else {
        ctx_local._4_4_ = 1;
      }
    }
  }
  return ctx_local._4_4_;
}

Assistant:

int spng_set_ihdr(spng_ctx *ctx, struct spng_ihdr *ihdr)
{
    SPNG_SET_CHUNK_BOILERPLATE(ihdr);

    if(ctx->stored.ihdr) return 1;

    ret = check_ihdr(ihdr, ctx->max_width, ctx->max_height);
    if(ret) return ret;

    ctx->ihdr = *ihdr;

    ctx->stored.ihdr = 1;
    ctx->user.ihdr = 1;

    return 0;
}